

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

string * __thiscall
tinyusdz::usdc::USDCReader::GetWarning_abi_cxx11_(string *__return_storage_ptr__,USDCReader *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->impl_->_warn);
  return __return_storage_ptr__;
}

Assistant:

std::string USDCReader::GetWarning() { return impl_->GetWarning(); }